

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error externalEntityInitProcessor2(XML_Parser parser,char *start,char *end,char **endPtr)

{
  int iVar1;
  char *pcStack_38;
  int tok;
  char *next;
  char **endPtr_local;
  char *end_local;
  char *start_local;
  XML_Parser parser_local;
  
  next = (char *)endPtr;
  endPtr_local = (char **)end;
  end_local = start;
  start_local = (char *)parser;
  iVar1 = (**(code **)(*(long *)((long)parser + 0x118) + 8))
                    (*(long *)((long)parser + 0x118),start,end,&stack0xffffffffffffffc8);
  if (iVar1 == -2) {
    if (next == (char *)0x0) {
      *(char **)(start_local + 0x218) = end_local;
      parser_local._4_4_ = XML_ERROR_PARTIAL_CHAR;
    }
    else {
      *(char **)next = end_local;
      parser_local._4_4_ = XML_ERROR_NONE;
    }
  }
  else if (iVar1 == -1) {
    if (next == (char *)0x0) {
      *(char **)(start_local + 0x218) = end_local;
      parser_local._4_4_ = XML_ERROR_UNCLOSED_TOKEN;
    }
    else {
      *(char **)next = end_local;
      parser_local._4_4_ = XML_ERROR_NONE;
    }
  }
  else {
    if (iVar1 == 0xe) {
      end_local = pcStack_38;
    }
    *(code **)(start_local + 0x208) = externalEntityInitProcessor3;
    parser_local._4_4_ =
         externalEntityInitProcessor3(start_local,end_local,(char *)endPtr_local,(char **)next);
  }
  return parser_local._4_4_;
}

Assistant:

static
enum XML_Error externalEntityInitProcessor2(XML_Parser parser,
                                            const char *start,
                                            const char *end,
                                            const char **endPtr)
{
  const char *next;
  int tok = XmlContentTok(encoding, start, end, &next);
  switch (tok) {
  case XML_TOK_BOM:
    start = next;
    break;
  case XML_TOK_PARTIAL:
    if (endPtr) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    eventPtr = start;
    return XML_ERROR_UNCLOSED_TOKEN;
  case XML_TOK_PARTIAL_CHAR:
    if (endPtr) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    eventPtr = start;
    return XML_ERROR_PARTIAL_CHAR;
  }
  processor = externalEntityInitProcessor3;
  return externalEntityInitProcessor3(parser, start, end, endPtr);
}